

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

CopyStatus cmsys::SystemTools::CopyFileIfDifferent(string *source,string *destination)

{
  bool bVar1;
  Status s;
  CopyStatus CVar2;
  undefined1 local_48 [8];
  string new_destination;
  string *destination_local;
  string *source_local;
  WhichPath local_c;
  
  new_destination.field_2._8_8_ = destination;
  bVar1 = FileIsDirectory(destination);
  if (bVar1) {
    FileInDir((string *)local_48,source,(string *)new_destination.field_2._8_8_);
    bVar1 = ComparePath((string *)local_48,(string *)new_destination.field_2._8_8_);
    if (!bVar1) {
      join_0x00000010_0x00000000_ = CopyFileIfDifferent(source,(string *)local_48);
    }
    std::__cxx11::string::~string((string *)local_48);
    if (!bVar1) {
      return stack0xffffffffffffffec;
    }
  }
  else {
    bVar1 = FilesDiffer(source,(string *)new_destination.field_2._8_8_);
    if (bVar1) {
      CVar2 = CopyFileAlways(source,(string *)new_destination.field_2._8_8_);
      return CVar2;
    }
  }
  s = Status::Success();
  CopyStatus::CopyStatus((CopyStatus *)((long)&source_local + 4),s,NoPath);
  return stack0xffffffffffffffec;
}

Assistant:

SystemTools::CopyStatus SystemTools::CopyFileIfDifferent(
  std::string const& source, std::string const& destination)
{
  // special check for a destination that is a directory
  // FilesDiffer does not handle file to directory compare
  if (SystemTools::FileIsDirectory(destination)) {
    const std::string new_destination = FileInDir(source, destination);
    if (!SystemTools::ComparePath(new_destination, destination)) {
      return SystemTools::CopyFileIfDifferent(source, new_destination);
    }
  } else {
    // source and destination are files so do a copy if they
    // are different
    if (SystemTools::FilesDiffer(source, destination)) {
      return SystemTools::CopyFileAlways(source, destination);
    }
  }
  // at this point the files must be the same so return true
  return CopyStatus{ Status::Success(), CopyStatus::NoPath };
}